

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O3

void __thiscall Vgm_Emu::set_tempo_(Vgm_Emu *this,double t)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  if (this->psg_rate != 0) {
    lVar1 = (long)(t * 44100.0 + 0.5);
    this->vgm_rate = lVar1;
    dVar3 = 1.0 / (double)lVar1;
    dVar2 = floor((double)this->psg_rate * 4096.0 * dVar3 + 0.5);
    (this->super_Vgm_Emu_Impl).blip_time_factor = (int)(long)dVar2;
    dVar2 = floor(this->fm_rate * 4096.0 * dVar3 + 0.5);
    (this->super_Vgm_Emu_Impl).fm_time_factor = (int)(long)dVar2 + 2;
  }
  return;
}

Assistant:

void Vgm_Emu::set_tempo_( double t )
{
	if ( psg_rate )
	{
		vgm_rate = (long) (44100 * t + 0.5);
		blip_time_factor = (long) floor( double (1L << blip_time_bits) / vgm_rate * psg_rate + 0.5 );
		//debug_printf( "blip_time_factor: %ld\n", blip_time_factor );
		//debug_printf( "vgm_rate: %ld\n", vgm_rate );
		// TODO: remove? calculates vgm_rate more accurately (above differs at most by one Hz only)
		//blip_time_factor = (long) floor( double (1L << blip_time_bits) * psg_rate / 44100 / t + 0.5 );
		//vgm_rate = (long) floor( double (1L << blip_time_bits) * psg_rate / blip_time_factor + 0.5 );
		
		fm_time_factor = 2 + (long) floor( fm_rate * (1L << fm_time_bits) / vgm_rate + 0.5 );
	}
}